

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

char * mcpl_internal_malloc(size_t n)

{
  char *pcVar1;
  
  pcVar1 = (char *)malloc(n + (n == 0));
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  mcpl_error("memory allocation failed");
}

Assistant:

MCPL_LOCAL char * mcpl_internal_malloc(size_t n)
{
  char * res = (char*)malloc(n ? n : 1);
  if (!res)
    mcpl_error("memory allocation failed");
  return res;
}